

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base.cpp
# Opt level: O3

CBlockIndex * NextSyncBlock(CBlockIndex *pindex_prev,CChain *chain)

{
  long lVar1;
  pointer ppCVar2;
  CBlockIndex *pCVar3;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (pindex_prev == (CBlockIndex *)0x0) {
    ppCVar2 = (chain->vChain).super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>.
              _M_impl.super__Vector_impl_data._M_start;
    if ((chain->vChain).super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>._M_impl.
        super__Vector_impl_data._M_finish == ppCVar2) {
      pCVar3 = (CBlockIndex *)0x0;
    }
    else {
      pCVar3 = *ppCVar2;
    }
  }
  else {
    pCVar3 = CChain::Next(chain,pindex_prev);
    if (pCVar3 == (CBlockIndex *)0x0) {
      pCVar3 = CChain::FindFork(chain,pindex_prev);
      if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
        pCVar3 = CChain::Next(chain,pCVar3);
        return pCVar3;
      }
      goto LAB_0087d201;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return pCVar3;
  }
LAB_0087d201:
  __stack_chk_fail();
}

Assistant:

EXCLUSIVE_LOCKS_REQUIRED(cs_main)
{
    AssertLockHeld(cs_main);

    if (!pindex_prev) {
        return chain.Genesis();
    }

    const CBlockIndex* pindex = chain.Next(pindex_prev);
    if (pindex) {
        return pindex;
    }

    return chain.Next(chain.FindFork(pindex_prev));
}